

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.c
# Opt level: O2

char * preprocess(char *source)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  char **ppcVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  void *__ptr;
  char *pcVar9;
  FILE *source_00;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  int local_54;
  char *local_50;
  char *local_48;
  int local_3c;
  char *local_38;
  
  local_54 = 0;
  inprocess = inprocess + 1;
  local_50 = (char *)malloc(1);
  *local_50 = '\0';
  local_3c = 0;
  iVar6 = 0;
  iVar16 = 0;
  local_38 = source;
LAB_00106673:
  do {
    while( true ) {
      if (source[iVar6] == '\0') {
        free(source);
        pcVar9 = local_50;
        if (local_3c != 0) {
          pcVar9 = preprocess(local_50);
        }
        ppcVar4 = inclusionTable;
        inprocess = inprocess + -1;
        if (inprocess == 0) {
          uVar13 = 0;
          uVar12 = (ulong)(uint)count;
          if (count < 1) {
            uVar12 = uVar13;
          }
          for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
            free(ppcVar4[uVar13]);
          }
          free(ppcVar4);
        }
        return pcVar9;
      }
      pcVar7 = readline(source,&local_54);
      iVar16 = iVar16 + 1;
      sVar8 = strlen(pcVar7);
      pcVar9 = local_50;
      iVar5 = (int)sVar8;
      if (6 < iVar5) break;
LAB_001066bb:
      uVar12 = 0;
      if (0 < iVar5) {
        uVar12 = sVar8 & 0xffffffff;
      }
      for (uVar13 = 0;
          (uVar14 = uVar12, uVar12 != uVar13 &&
          ((pcVar7[uVar13] == ' ' || (uVar14 = uVar13, pcVar7[uVar13] == '\t'))));
          uVar13 = uVar13 + 1) {
      }
      iVar6 = local_54;
      if ((int)uVar14 != iVar5) {
        cVar1 = pcVar7[uVar14 & 0xffffffff];
        if (((cVar1 != '\n') && (cVar1 != '\r')) &&
           ((cVar1 != '/' || iVar5 + -1 <= (int)uVar14 || (pcVar7[(uVar14 & 0xffffffff) + 1] != '/')
            ))) {
          for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
            if ((pcVar7[uVar13] != ' ') && (pcVar7[uVar13] != '\t')) {
              uVar12 = uVar13 & 0xffffffff;
              break;
            }
          }
          if ((((int)uVar12 < iVar5 + -1) && (pcVar7[uVar12] == '/')) && (pcVar7[uVar12 + 1] == '*')
             ) {
            while( true ) {
              sVar8 = strlen(pcVar7);
              iVar6 = (int)sVar8;
              if (((2 < iVar6) && (pcVar7[iVar6 - 2] == '/')) && (pcVar7[iVar6 - 3] == '*')) break;
              free(pcVar7);
              pcVar7 = readline(source,&local_54);
            }
            free(pcVar7);
            iVar6 = local_54;
          }
          else {
            local_48 = str_append(local_50,pcVar7);
            free(pcVar9);
            free(pcVar7);
            local_50 = local_48;
            iVar6 = local_54;
          }
        }
      }
    }
    lVar15 = 0;
    while (lVar15 != 7) {
      pcVar11 = pcVar7 + lVar15;
      pcVar10 = "Include" + lVar15;
      lVar15 = lVar15 + 1;
      if (*pcVar11 != *pcVar10) goto LAB_001066bb;
    }
    local_48 = (char *)CONCAT44(local_48._4_4_,iVar16);
    __ptr = (void *)0x0;
    sVar8 = 0;
    while( true ) {
      bVar2 = pcVar7[sVar8 + 8];
      if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
      __ptr = realloc(__ptr,sVar8 + 1);
      *(byte *)((long)__ptr + sVar8) = bVar2;
      sVar8 = sVar8 + 1;
    }
    pcVar9 = (char *)realloc(__ptr,(ulong)((int)sVar8 + 1));
    pcVar9[sVar8] = '\0';
    ppcVar4 = inclusionTable;
    uVar3 = count;
    if (count < 1) {
      uVar3 = 0;
    }
    uVar12 = 0;
    do {
      if (uVar3 == uVar12) {
        source_00 = fopen(pcVar9,"rb");
        if (source_00 == (FILE *)0x0) {
          iVar16 = (int)local_48;
          printf("\x1b[33m\n[Warning] [Line %d] Unable to open file for inclusion : %s\x1b[0m",
                 (ulong)local_48 & 0xffffffff,pcVar9);
        }
        else {
          local_3c = local_3c + 1;
          pcVar10 = read_all((FILE *)source_00);
          lVar15 = (long)count;
          count = count + 1;
          inclusionTable = (char **)realloc(inclusionTable,lVar15 * 8 + 8);
          pcVar7 = local_50;
          inclusionTable[lVar15] = pcVar9;
          pcVar11 = str_append(local_50,pcVar10);
          free(pcVar10);
          free(pcVar7);
          iVar16 = (int)local_48;
          local_50 = pcVar11;
        }
        free(pcVar9);
        source = local_38;
        iVar6 = local_54;
        goto LAB_00106673;
      }
      iVar16 = strcmp(ppcVar4[uVar12],pcVar9);
      uVar12 = uVar12 + 1;
    } while (iVar16 != 0);
    printf("\x1b[32m\n[Debug] [Preprocessor] Skipping duplicate inclusion of %s\x1b[0m",pcVar9);
    free(pcVar9);
    free(pcVar7);
    source = local_38;
    iVar6 = local_54;
    iVar16 = (int)local_48;
  } while( true );
}

Assistant:

char* preprocess(char *source){
    int i = 0, lcount = 0, hasInclude = 0;
    inprocess++;
    char *result = (char *)mallocate(sizeof(char) * 1), *bak = NULL;
    result[0] = '\0';
    while(source[i] != '\0'){
        char *line = readline(source, &i);
     //   printf(debug("Line : [%s]"), line);
        lcount++;
        if(startsWith(line, "Include")){
            char *toInclude = str_part(line, 8); // Include
            if(has_in_table(toInclude)){
                printf(debug("[Preprocessor] Skipping duplicate inclusion of %s"), toInclude);
                memfree(toInclude);
                memfree(line);
                continue;
            }
            FILE *include = fopen(toInclude, "rb");
            if(include == NULL)
                printf(warning("[Line %d] Unable to open file for inclusion : %s"), lcount, toInclude);
            else{
                hasInclude++;
                char *content = read_all(include);
                add_to_table(toInclude);
                bak = result;
                result = str_append(result, content);
                memfree(content);
                memfree(bak);
            }
            memfree(toInclude);
        }
        else if(!isEmpty(line)){
            if(is_start_of_mc(line)){
                while(!is_end_of_mc(line)){
                    memfree(line);
                    line = readline(source, &i);
                }
                memfree(line);
            }
            else{
                bak = result;
                result = str_append(result, line);
                memfree(bak);
                memfree(line);
            }
        }
       // memfree(line);
    }
    memfree(source);
    if(hasInclude){
        result = preprocess(result);
    }
    inprocess--;
    if(inprocess == 0){
        i = 0;
        while(i < count){
            memfree(inclusionTable[i]);
            i++;
        }
        memfree(inclusionTable);
    }
    return result;
}